

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

char * gl4cts::apiToTestName(API api)

{
  bool *pbVar1;
  char *pcVar2;
  
  pcVar2 = ::glcts::fixed_sample_locations_values + 1;
  if (api == API_GL_ARB_clip_control) {
    pcVar2 = "clip_control_ARB";
  }
  pbVar1 = (bool *)0x1aad270;
  if (api != API_GL_45core) {
    pbVar1 = (bool *)pcVar2;
  }
  return pbVar1;
}

Assistant:

const char* apiToTestName(ClipControlTests::API api)
{
	switch (api)
	{
	case ClipControlTests::API_GL_45core:
		return "clip_control";
	case ClipControlTests::API_GL_ARB_clip_control:
		return "clip_control_ARB";
	}
	DE_ASSERT(0);
	return "";
}